

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O2

RK_S32 camera_source_get_frame(CamSource *ctx)

{
  v4l2_buf_type vVar1;
  RK_S32 RVar2;
  char *pcVar3;
  long local_a8 [8];
  v4l2_plane *local_68;
  ulong uStack_60;
  undefined8 local_58;
  v4l2_plane planes [1];
  
  vVar1 = ctx->type;
  local_a8[1] = 0;
  local_a8[6] = 0;
  local_68 = (v4l2_plane *)0x0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_58 = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = (ulong)vVar1 << 0x20;
  local_a8[7] = 0x100000000;
  if (vVar1 == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE) {
    local_68 = planes;
  }
  uStack_60 = (ulong)(vVar1 == V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE);
  RVar2 = camera_source_ioctl(ctx->fd,-0x3fa7a9ef,local_a8);
  if (RVar2 == -1) {
    pcVar3 = "VIDIOC_DQBUF\n";
  }
  else {
    if ((uint)local_a8[0] <= ctx->bufcnt) {
      return (uint)local_a8[0];
    }
    pcVar3 = "buffer index out of bounds\n";
  }
  _mpp_log_l(2,"camera_source",pcVar3,"camera_source_get_frame");
  return -1;
}

Assistant:

RK_S32 camera_source_get_frame(CamSource *ctx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;

    type = ctx->type;
    buf = (struct v4l2_buffer) {0};
    buf.type   = type;
    buf.memory = V4L2_MEMORY_MMAP;

    struct v4l2_plane planes[FMT_NUM_PLANES];
    if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type) {
        buf.m.planes = planes;
        buf.length = FMT_NUM_PLANES;
    }

    if (-1 == camera_source_ioctl(ctx->fd, VIDIOC_DQBUF, &buf)) {
        mpp_err_f("VIDIOC_DQBUF\n");
        return -1;
    }

    if (buf.index > ctx->bufcnt) {
        mpp_err_f("buffer index out of bounds\n");
        return -1;
    }

    if (V4L2_BUF_TYPE_VIDEO_CAPTURE_MPLANE == type)
        buf.bytesused = buf.m.planes[0].bytesused;

    return buf.index;
}